

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int y;
  int iVar8;
  undefined4 uVar9;
  byte *__s;
  int iVar11;
  int iVar12;
  undefined1 auVar10 [16];
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  
  if (this->_data != (uchar *)0x0) {
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar13 = this->_spectrum;
    auVar10._0_4_ = -(uint)(uVar1 == 0);
    auVar10._4_4_ = -(uint)(uVar2 == 0);
    auVar10._8_4_ = -(uint)(uVar3 == 0);
    auVar10._12_4_ = -(uint)(uVar13 == 0);
    uVar9 = movmskps((int)this,auVar10);
    if ((char)uVar9 == '\0') {
      uVar16 = -(uint)(x0 < x1);
      uVar17 = -(uint)(y0 < y1);
      uVar18 = -(uint)(z0 < z1);
      uVar19 = -(uint)(c0 < c1);
      uVar5 = x0 & uVar16 | ~uVar16 & x1;
      uVar14 = y0 & uVar17 | ~uVar17 & y1;
      uVar7 = z0 & uVar18 | ~uVar18 & z1;
      uVar15 = c0 & uVar19 | ~uVar19 & c1;
      uVar16 = ~uVar16 & x0 | x1 & uVar16;
      uVar17 = ~uVar17 & y0 | y1 & uVar17;
      uVar18 = ~uVar18 & z0 | z1 & uVar18;
      uVar19 = ~uVar19 & c0 | c1 & uVar19;
      uVar16 = (~-(uint)((int)uVar16 < (int)uVar1) & (uVar16 ^ 0xffffffff) + uVar1) +
               (-(uint)((int)uVar5 < 0) & uVar5) + (-(uint)(x1 < x0) - (x0 - x1 ^ -(uint)(x1 < x0)))
               + 1;
      iVar11 = (~-(uint)((int)uVar17 < (int)uVar2) & (uVar17 ^ 0xffffffff) + uVar2) +
               (-(uint)((int)uVar14 < 0) & uVar14) +
               (-(uint)(y1 < y0) - (y0 - y1 ^ -(uint)(y1 < y0))) + 1;
      iVar12 = (~-(uint)((int)uVar18 < (int)uVar3) & (uVar18 ^ 0xffffffff) + uVar3) +
               (-(uint)((int)uVar7 < 0) & uVar7) + (-(uint)(z1 < z0) - (z0 - z1 ^ -(uint)(z1 < z0)))
               + 1;
      uVar13 = (~-(uint)((int)uVar19 < (int)uVar13) & (uVar19 ^ 0xffffffff) + uVar13) +
               (-(uint)((int)uVar15 < 0) & uVar15) +
               (-(uint)(c1 < c0) - (c0 - c1 ^ -(uint)(c1 < c0))) + 1;
      auVar20._0_4_ = -(uint)((int)uVar16 < 1);
      auVar20._4_4_ = -(uint)(iVar11 < 1);
      auVar20._8_4_ = -(uint)(iVar12 < 1);
      auVar20._12_4_ = -(uint)((int)uVar13 < 1);
      iVar6 = movmskps(z0,auVar20);
      if (iVar6 == 0) {
        uVar17 = 0;
        if ((int)uVar5 < 1) {
          uVar5 = uVar17;
        }
        if ((int)uVar14 < 1) {
          uVar14 = uVar17;
        }
        iVar6 = uVar2 * uVar1;
        if ((int)uVar7 < 1) {
          uVar7 = uVar17;
        }
        if ((int)uVar15 < 1) {
          uVar15 = uVar17;
        }
        __s = this->_data +
              (ulong)(iVar6 * uVar3 * uVar15) + (ulong)(uVar7 * iVar6) +
              (ulong)(uVar14 * uVar1) + (ulong)uVar5;
        do {
          iVar4 = 0;
          do {
            iVar8 = 0;
            do {
              uVar5 = uVar16;
              if (1.0 <= opacity) {
                memset(__s,(uint)val,(ulong)uVar16);
                __s = __s + this->_width;
              }
              else {
                do {
                  *__s = (byte)(int)((float)*__s *
                                     (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity)) +
                                    (float)val * ABS(opacity));
                  __s = __s + 1;
                  uVar5 = uVar5 - 1;
                } while (uVar5 != 0);
                __s = __s + (uVar1 - uVar16);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != iVar11);
            __s = __s + (uVar2 - iVar11) * uVar1;
            iVar4 = iVar4 + 1;
          } while (iVar4 != iVar12);
          __s = __s + (uVar3 - iVar12) * iVar6;
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar13);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned int offX = _width - lX, offY = _width*(_height - lY), offZ = _width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }